

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall
tinygltf::AnimationSampler::AnimationSampler(AnimationSampler *this,AnimationSampler *param_1)

{
  int iVar1;
  
  iVar1 = param_1->output;
  this->input = param_1->input;
  this->output = iVar1;
  std::__cxx11::string::string((string *)&this->interpolation,(string *)&param_1->interpolation);
  Value::Value(&this->extras,&param_1->extras);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

AnimationSampler() : interpolation("LINEAR") {}